

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O1

bool __thiscall QJpegHandler::supportsOption(QJpegHandler *this,ImageOption option)

{
  return (bool)((byte)(0x7c29f >> ((byte)option & 0x1f)) & option < (ImageTransformation|ClipRect));
}

Assistant:

bool QJpegHandler::supportsOption(ImageOption option) const
{
    return option == Quality
        || option == ScaledSize
        || option == ScaledClipRect
        || option == ClipRect
        || option == Description
        || option == Size
        || option == SubType
        || option == SupportedSubTypes
        || option == ImageFormat
        || option == OptimizedWrite
        || option == ProgressiveScanWrite
        || option == ImageTransformation;
}